

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

void __thiscall VirtualFileSystem::~VirtualFileSystem(VirtualFileSystem *this)

{
  VirtualFileSystem *this_local;
  
  ~VirtualFileSystem(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

VirtualFileSystem() : now_(1) {}